

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

FormulaUnit * __thiscall
Kernel::LocalFormulaUnitTransformer::transform(LocalFormulaUnitTransformer *this,FormulaUnit *unit)

{
  Formula *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  FormulaUnit *this_00;
  FormulaClauseTransformation local_60;
  Inference local_50;
  
  pFVar1 = unit->_formula;
  iVar2 = (*(this->super_FormulaUnitTransformer)._vptr_FormulaUnitTransformer[3])(this,pFVar1);
  if (pFVar1 != (Formula *)CONCAT44(extraout_var,iVar2)) {
    this_00 = (FormulaUnit *)FormulaUnit::operator_new(0x48);
    local_60.rule = this->_rule;
    local_60.premise = &unit->super_Unit;
    Inference::Inference(&local_50,&local_60);
    FormulaUnit::FormulaUnit(this_00,(Formula *)CONCAT44(extraout_var,iVar2),&local_50);
    unit = this_00;
  }
  return unit;
}

Assistant:

FormulaUnit* LocalFormulaUnitTransformer::transform(FormulaUnit* unit)
{
  Formula* f = unit->formula();
  Formula* newForm = transform(f);
  if(f==newForm) {
    return unit;
  }
  return new FormulaUnit(newForm, FormulaClauseTransformation(_rule, unit));
}